

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFontAtlas *pIVar3;
  ImFont *this;
  ImFontConfig *pIVar4;
  bool bVar5;
  bool bVar6;
  ImU32 IVar7;
  ImGuiStyle *v;
  char *pcVar8;
  size_t sVar9;
  ImGuiIO *pIVar10;
  ImFont **ppIVar11;
  ImGuiIO *pIVar12;
  ImGuiStyle *pIVar13;
  ImFontGlyph *pIVar14;
  ImDrawList *pIVar15;
  int i;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int n_2;
  ImVec4 *pIVar19;
  int i_1;
  void *ptr_id;
  uint base;
  uint c_begin;
  uint n;
  int iVar20;
  uint uVar21;
  ImVec4 *pIVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  bool border;
  undefined7 uStack_c7;
  float fStack_c4;
  undefined8 uStack_c0;
  float local_ac;
  float *local_a8;
  int local_a0;
  ImU32 local_9c;
  ImVec2 local_98;
  ImVec2 cell_p2;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar20 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar20 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  pIVar13 = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    pIVar13 = ref;
  }
  fVar23 = GetWindowWidth();
  PushItemWidth(fVar23 * 0.5);
  bVar5 = ShowStyleSelector("Colors##Selector");
  if (bVar5) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
  }
  ShowFontSelector("Fonts##Selector");
  bVar5 = SliderFloat("FrameRounding",&v->FrameRounding,0.0,12.0,"%.0f",0);
  if (bVar5) {
    v->GrabRounding = v->FrameRounding;
  }
  border = 0.0 < v->WindowBorderSize;
  bVar5 = Checkbox("WindowBorder",&border);
  if (bVar5) {
    if (border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->WindowBorderSize = fVar23;
  }
  SameLine(0.0,-1.0);
  border = 0.0 < v->FrameBorderSize;
  bVar5 = Checkbox("FrameBorder",&border);
  if (bVar5) {
    if (border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->FrameBorderSize = fVar23;
  }
  SameLine(0.0,-1.0);
  border = 0.0 < v->PopupBorderSize;
  bVar5 = Checkbox("PopupBorder",&border);
  if (bVar5) {
    if (border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->PopupBorderSize = fVar23;
  }
  _border = 0.0;
  fStack_c4 = 0.0;
  bVar5 = Button("Save Ref",(ImVec2 *)&border);
  if (bVar5) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
    memmove(pIVar13,v,0x414);
  }
  SameLine(0.0,-1.0);
  _border = 0.0;
  fStack_c4 = 0.0;
  bVar5 = Button("Revert Ref",(ImVec2 *)&border);
  if (bVar5) {
    memcpy(v,pIVar13,0x414);
  }
  SameLine(0.0,-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  Separator();
  bVar5 = BeginTabBar("##tabs",0);
  if (bVar5) {
    bVar5 = BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar5) {
      Text("Main");
      local_a8 = &v->FrameRounding;
      SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("CellPadding",&(v->CellPadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",0);
      SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",0);
      SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",0);
      SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",0);
      SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",0);
      SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",0);
      Text("Borders");
      SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("TabBorderSize",&v->TabBorderSize,0.0,1.0,"%.0f",0);
      Text("Rounding");
      SliderFloat("WindowRounding",&v->WindowRounding,0.0,12.0,"%.0f",0);
      SliderFloat("ChildRounding",&v->ChildRounding,0.0,12.0,"%.0f",0);
      SliderFloat("FrameRounding",local_a8,0.0,12.0,"%.0f",0);
      SliderFloat("PopupRounding",&v->PopupRounding,0.0,12.0,"%.0f",0);
      SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",0);
      SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",0);
      SliderFloat("LogSliderDeadzone",&v->LogSliderDeadzone,0.0,12.0,"%.0f",0);
      SliderFloat("TabRounding",&v->TabRounding,0.0,12.0,"%.0f",0);
      Text("Alignment");
      SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",0);
      _border = (float)(v->WindowMenuButtonPosition + 1);
      bVar5 = Combo("WindowMenuButtonPosition",(int *)&border,"None",-1);
      if (bVar5) {
        v->WindowMenuButtonPosition = (int)_border + -1;
      }
      Combo("ColorButtonPosition",&v->ColorButtonPosition,"Left",-1);
      SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      SliderFloat2("SelectableTextAlign",&(v->SelectableTextAlign).x,0.0,1.0,"%.2f",0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      Text("Safe Area Padding");
      SameLine(0.0,-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",0);
      EndTabItem();
    }
    bVar5 = BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar5) {
      _border = 0.0;
      fStack_c4 = 0.0;
      bVar5 = Button("Export",(ImVec2 *)&border);
      if (bVar5) {
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(-1);
        }
        else {
          LogToTTY(-1);
        }
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        pIVar22 = v->Colors;
        pIVar19 = pIVar13->Colors;
        for (lVar17 = 0; lVar17 != 0x35; lVar17 = lVar17 + 1) {
          pcVar8 = GetStyleColorName((ImGuiCol)lVar17);
          if (ShowStyleEditor::output_only_modified == true) {
            auVar25[0] = -(*(char *)&pIVar22->x == *(char *)&pIVar19->x);
            auVar25[1] = -(*(char *)((long)&pIVar22->x + 1) == *(char *)((long)&pIVar19->x + 1));
            auVar25[2] = -(*(char *)((long)&pIVar22->x + 2) == *(char *)((long)&pIVar19->x + 2));
            auVar25[3] = -(*(char *)((long)&pIVar22->x + 3) == *(char *)((long)&pIVar19->x + 3));
            auVar25[4] = -(*(char *)&pIVar22->y == *(char *)&pIVar19->y);
            auVar25[5] = -(*(char *)((long)&pIVar22->y + 1) == *(char *)((long)&pIVar19->y + 1));
            auVar25[6] = -(*(char *)((long)&pIVar22->y + 2) == *(char *)((long)&pIVar19->y + 2));
            auVar25[7] = -(*(char *)((long)&pIVar22->y + 3) == *(char *)((long)&pIVar19->y + 3));
            auVar25[8] = -(*(char *)&pIVar22->z == *(char *)&pIVar19->z);
            auVar25[9] = -(*(char *)((long)&pIVar22->z + 1) == *(char *)((long)&pIVar19->z + 1));
            auVar25[10] = -(*(char *)((long)&pIVar22->z + 2) == *(char *)((long)&pIVar19->z + 2));
            auVar25[0xb] = -(*(char *)((long)&pIVar22->z + 3) == *(char *)((long)&pIVar19->z + 3));
            auVar25[0xc] = -(*(char *)&pIVar22->w == *(char *)&pIVar19->w);
            auVar25[0xd] = -(*(char *)((long)&pIVar22->w + 1) == *(char *)((long)&pIVar19->w + 1));
            auVar25[0xe] = -(*(char *)((long)&pIVar22->w + 2) == *(char *)((long)&pIVar19->w + 2));
            auVar25[0xf] = -(*(char *)((long)&pIVar22->w + 3) == *(char *)((long)&pIVar19->w + 3));
            if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00131339;
          }
          else {
LAB_00131339:
            sVar9 = strlen(pcVar8);
            LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                    (double)pIVar22->x,(double)pIVar22->y,(double)pIVar22->z,(double)pIVar22->w,
                    pcVar8,(ulong)(0x17 - (int)sVar9),"");
          }
          pIVar19 = pIVar19 + 1;
          pIVar22 = pIVar22 + 1;
        }
        LogFinish();
      }
      SameLine(0.0,-1.0);
      SetNextItemWidth(120.0);
      Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      SameLine(0.0,-1.0);
      Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
        iVar20 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
        if (iVar20 != 0) {
          ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
          __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
          __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
        }
      }
      fVar23 = GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar23 * 16.0);
      bVar5 = RadioButton("Opaque",ShowStyleEditor::alpha_flags == 0);
      if (bVar5) {
        ShowStyleEditor::alpha_flags = 0;
      }
      SameLine(0.0,-1.0);
      bVar5 = RadioButton("Alpha",ShowStyleEditor::alpha_flags == 0x20000);
      if (bVar5) {
        ShowStyleEditor::alpha_flags = 0x20000;
      }
      SameLine(0.0,-1.0);
      bVar5 = RadioButton("Both",ShowStyleEditor::alpha_flags == 0x40000);
      if (bVar5) {
        ShowStyleEditor::alpha_flags = 0x40000;
      }
      SameLine(0.0,-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on color square to open color picker,\nRight-click to open edit options menu."
                );
      _border = 0.0;
      fStack_c4 = 0.0;
      BeginChild("##colors",(ImVec2 *)&border,true,0x80c000);
      PushItemWidth(-160.0);
      pIVar22 = v->Colors;
      pIVar19 = pIVar13->Colors;
      for (lVar17 = 0; lVar17 != 0x35; lVar17 = lVar17 + 1) {
        pcVar8 = GetStyleColorName((ImGuiCol)lVar17);
        bVar5 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar8,(char *)0x0);
        if (bVar5) {
          PushID((ImGuiCol)lVar17);
          ColorEdit4("##color",&pIVar22->x,ShowStyleEditor::alpha_flags | 0x10000);
          auVar26[0] = -(*(char *)&pIVar22->x == *(char *)&pIVar19->x);
          auVar26[1] = -(*(char *)((long)&pIVar22->x + 1) == *(char *)((long)&pIVar19->x + 1));
          auVar26[2] = -(*(char *)((long)&pIVar22->x + 2) == *(char *)((long)&pIVar19->x + 2));
          auVar26[3] = -(*(char *)((long)&pIVar22->x + 3) == *(char *)((long)&pIVar19->x + 3));
          auVar26[4] = -(*(char *)&pIVar22->y == *(char *)&pIVar19->y);
          auVar26[5] = -(*(char *)((long)&pIVar22->y + 1) == *(char *)((long)&pIVar19->y + 1));
          auVar26[6] = -(*(char *)((long)&pIVar22->y + 2) == *(char *)((long)&pIVar19->y + 2));
          auVar26[7] = -(*(char *)((long)&pIVar22->y + 3) == *(char *)((long)&pIVar19->y + 3));
          auVar26[8] = -(*(char *)&pIVar22->z == *(char *)&pIVar19->z);
          auVar26[9] = -(*(char *)((long)&pIVar22->z + 1) == *(char *)((long)&pIVar19->z + 1));
          auVar26[10] = -(*(char *)((long)&pIVar22->z + 2) == *(char *)((long)&pIVar19->z + 2));
          auVar26[0xb] = -(*(char *)((long)&pIVar22->z + 3) == *(char *)((long)&pIVar19->z + 3));
          auVar26[0xc] = -(*(char *)&pIVar22->w == *(char *)&pIVar19->w);
          auVar26[0xd] = -(*(char *)((long)&pIVar22->w + 1) == *(char *)((long)&pIVar19->w + 1));
          auVar26[0xe] = -(*(char *)((long)&pIVar22->w + 2) == *(char *)((long)&pIVar19->w + 2));
          auVar26[0xf] = -(*(char *)((long)&pIVar22->w + 3) == *(char *)((long)&pIVar19->w + 3));
          if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar26[0xf] >> 7) << 0xf) != 0xffff) {
            SameLine(0.0,(v->ItemInnerSpacing).x);
            _border = 0.0;
            fStack_c4 = 0.0;
            bVar5 = Button("Save",(ImVec2 *)&border);
            if (bVar5) {
              fVar23 = pIVar22->y;
              fVar24 = pIVar22->z;
              fVar27 = pIVar22->w;
              pIVar19->x = pIVar22->x;
              pIVar19->y = fVar23;
              pIVar19->z = fVar24;
              pIVar19->w = fVar27;
            }
            SameLine(0.0,(v->ItemInnerSpacing).x);
            _border = 0.0;
            fStack_c4 = 0.0;
            bVar5 = Button("Revert",(ImVec2 *)&border);
            if (bVar5) {
              fVar23 = pIVar19->y;
              fVar24 = pIVar19->z;
              fVar27 = pIVar19->w;
              pIVar22->x = pIVar19->x;
              pIVar22->y = fVar23;
              pIVar22->z = fVar24;
              pIVar22->w = fVar27;
            }
          }
          SameLine(0.0,(v->ItemInnerSpacing).x);
          TextUnformatted(pcVar8,(char *)0x0);
          PopID();
        }
        pIVar19 = pIVar19 + 1;
        pIVar22 = pIVar22 + 1;
      }
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar5 = BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar5) {
      pIVar10 = GetIO();
      pIVar3 = pIVar10->Fonts;
      HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
      PushItemWidth(120.0);
      iVar20 = 0;
      while (iVar20 < (pIVar3->Fonts).Size) {
        local_a0 = iVar20;
        ppIVar11 = ImVector<ImFont_*>::operator[](&pIVar3->Fonts,iVar20);
        this = *ppIVar11;
        PushID(this);
        pIVar12 = GetIO();
        pIVar13 = GetStyle();
        pcVar8 = this->ConfigData->Name;
        if (this->ConfigData == (ImFontConfig *)0x0) {
          pcVar8 = "";
        }
        bVar5 = TreeNode(this,"Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",(double)this->FontSize,
                         pcVar8,(ulong)(uint)(this->Glyphs).Size,
                         (ulong)(uint)(int)this->ConfigDataCount);
        SameLine(0.0,-1.0);
        bVar6 = SmallButton("Set as default");
        if (bVar6) {
          pIVar12->FontDefault = this;
        }
        if (bVar5) {
          PushFont((ImFont *)0x131721);
          Text("The quick brown fox jumps over the lazy dog");
          PopFont();
          DragFloat("Font scale",&this->Scale,0.005,0.3,2.0,"%.1f",0);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)"
                    );
          Text("Ascent: %f, Descent: %f, Height: %f",(double)this->Ascent,(double)this->Descent,
               (double)(this->Ascent - this->Descent));
          Text("Fallback character: \'%c\' (U+%04X)",(ulong)this->FallbackChar);
          Text("Ellipsis character: \'%c\' (U+%04X)",(ulong)this->EllipsisChar);
          fVar23 = (float)this->MetricsTotalSurface;
          if (fVar23 < 0.0) {
            fVar23 = sqrtf(fVar23);
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)this->MetricsTotalSurface,
               (ulong)(uint)(int)fVar23);
          lVar17 = 0x56;
          for (uVar18 = 0; (long)uVar18 < (long)this->ConfigDataCount; uVar18 = uVar18 + 1) {
            pIVar4 = this->ConfigData;
            if (pIVar4 != (ImFontConfig *)0x0) {
              BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)"
                         ,(double)*(float *)(pIVar4->Name + lVar17 + -0x80),
                         (double)*(float *)(pIVar4->Name + lVar17 + -0x7c),uVar18 & 0xffffffff,
                         pIVar4->Name + lVar17 + -0x56,
                         (ulong)*(uint *)((long)pIVar4 + lVar17 + -0x3e),
                         (ulong)*(uint *)((long)pIVar4 + lVar17 + -0x3a),
                         (ulong)*(byte *)((long)pIVar4 + lVar17 + -0x36));
            }
            lVar17 = lVar17 + 0x88;
          }
          bVar5 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(this->Glyphs).Size);
          if (bVar5) {
            local_9c = GetColorU32(0,1.0);
            ptr_id = (void *)0x0;
            while (c_begin = (uint)ptr_id, c_begin < 0x10000) {
              if (((ulong)ptr_id & 0xfff) == 0) {
                bVar5 = ImFont::IsGlyphRangeUnused(this,c_begin,c_begin | 0xfff);
                if (!bVar5) goto LAB_001318c3;
                c_begin = c_begin | 0xf00;
              }
              else {
LAB_001318c3:
                iVar20 = 0;
                uVar18 = 0;
                while( true ) {
                  iVar16 = (int)uVar18;
                  if (iVar20 == 0x100) break;
                  pIVar14 = ImFont::FindGlyphNoFallback(this,(short)ptr_id + (short)iVar20);
                  uVar18 = (ulong)((iVar16 + 1) - (uint)(pIVar14 == (ImFontGlyph *)0x0));
                  iVar20 = iVar20 + 1;
                }
                if (iVar16 != 0) {
                  pcVar8 = "glyphs";
                  if (iVar16 == 1) {
                    pcVar8 = "glyph";
                  }
                  bVar5 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",ptr_id,(ulong)(c_begin + 0xff),
                                   uVar18,pcVar8);
                  if (bVar5) {
                    local_a8 = (float *)CONCAT44(local_a8._4_4_,this->FontSize);
                    local_ac = (pIVar13->ItemSpacing).y + this->FontSize;
                    local_98 = GetCursorScreenPos();
                    pIVar15 = GetWindowDrawList();
                    fVar23 = local_98.y;
                    uVar18 = 0;
                    while (uVar21 = (uint)uVar18, uVar21 != 0x100) {
                      _border = (float)(uVar21 & 0xf) * local_ac + local_98.x;
                      fStack_c4 = (float)(int)(uVar18 >> 4) * local_ac + fVar23;
                      cell_p2.y = fStack_c4 + local_a8._0_4_;
                      cell_p2.x = _border + local_a8._0_4_;
                      pIVar14 = ImFont::FindGlyphNoFallback(this,(ImWchar)ptr_id);
                      IVar7 = 0x64ffffff;
                      if (pIVar14 == (ImFontGlyph *)0x0) {
                        IVar7 = 0x32ffffff;
                      }
                      ImDrawList::AddRect(pIVar15,(ImVec2 *)&border,&cell_p2,IVar7,0.0,0xf,1.0);
                      if (pIVar14 != (ImFontGlyph *)0x0) {
                        ImFont::RenderChar(this,pIVar15,local_a8._0_4_,_border,local_9c,
                                           (ImWchar)ptr_id);
                        bVar5 = IsMouseHoveringRect((ImVec2 *)&border,&cell_p2,true);
                        if (bVar5) {
                          BeginTooltip();
                          Text("Codepoint: U+%04X",ptr_id);
                          Separator();
                          Text("Visible: %d",(ulong)(*(uint *)pIVar14 >> 0x1f));
                          Text("AdvanceX: %.1f",(double)pIVar14->AdvanceX);
                          Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar14->X0,
                               (double)pIVar14->Y0,(double)pIVar14->X1,(double)pIVar14->Y1);
                          Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar14->U0,
                               (double)pIVar14->V0,(double)pIVar14->U1,(double)pIVar14->V1);
                          EndTooltip();
                        }
                      }
                      ptr_id = (void *)(ulong)((int)ptr_id + 1);
                      uVar18 = (ulong)(uVar21 + 1);
                    }
                    fStack_c4 = local_ac * 16.0;
                    _border = local_ac * 16.0;
                    Dummy((ImVec2 *)&border);
                    TreePop();
                  }
                }
              }
              ptr_id = (void *)(ulong)(c_begin + 0x100);
            }
            TreePop();
          }
          TreePop();
        }
        PopID();
        iVar20 = local_a0 + 1;
      }
      bVar5 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)pIVar3->TexWidth,
                       (ulong)(uint)pIVar3->TexHeight);
      if (bVar5) {
        _border = 1.0;
        fStack_c4 = 1.0;
        uStack_c0._0_4_ = 1.0;
        uStack_c0._4_4_ = 1.0;
        cell_p2.x = 1.0;
        cell_p2.y = 1.0;
        uVar1 = pIVar3->TexWidth;
        uVar2 = pIVar3->TexHeight;
        local_38.x = (float)(int)uVar1;
        local_38.y = (float)(int)uVar2;
        local_40.x = 0.0;
        local_40.y = 0.0;
        local_48.x = 1.0;
        local_48.y = 1.0;
        Image(pIVar3->TexID,&local_38,&local_40,&local_48,(ImVec4 *)&border,(ImVec4 *)&cell_p2);
        TreePop();
      }
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\nUsing those settings here will give you poor quality results."
                );
      bVar5 = DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",0x10);
      if (bVar5) {
        SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      DragFloat("global scale",&pIVar10->FontGlobalScale,0.005,0.3,2.0,"%.2f",0x10);
      PopItemWidth();
      EndTabItem();
    }
    bVar5 = BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar5) {
      Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
      SameLine(0.0,-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      Checkbox("Anti-aliased lines use texture",&v->AntiAliasedLinesUseTex);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering)."
                );
      Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
      PushItemWidth(100.0);
      DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,10.0,"%.2f",0);
      if (v->CurveTessellationTol <= 0.1 && v->CurveTessellationTol != 0.1) {
        v->CurveTessellationTol = 0.1;
      }
      iVar20 = 0;
      DragFloat("Circle Segment Max Error",&v->CircleSegmentMaxError,0.01,0.1,10.0,"%.2f",0);
      bVar5 = IsItemActive();
      if (bVar5) {
        _border = GetCursorScreenPos();
        cell_p2.x = 0.0;
        cell_p2.y = 0.0;
        SetNextWindowPos((ImVec2 *)&border,0,&cell_p2);
        BeginTooltip();
        local_98 = GetCursorScreenPos();
        pIVar15 = GetWindowDrawList();
        fVar24 = local_98.y + 80.0;
        fVar23 = 10.0;
        while( true ) {
          if (iVar20 == 7) break;
          fVar27 = ((float)iVar20 * 70.0) / 6.0 + 10.0;
          local_a8 = (float *)CONCAT44(local_a8._4_4_,fVar27);
          fStack_c4 = fVar24;
          _border = local_98.x + fVar23 + fVar27;
          local_ac = fVar23;
          IVar7 = GetColorU32(0,1.0);
          ImDrawList::AddCircle(pIVar15,(ImVec2 *)&border,local_a8._0_4_,IVar7,0,1.0);
          fVar23 = local_ac + local_a8._0_4_ + local_a8._0_4_ + 10.0;
          iVar20 = iVar20 + 1;
        }
        fStack_c4 = 160.0;
        _border = fVar23;
        Dummy((ImVec2 *)&border);
        EndTooltip();
      }
      SameLine(0.0,-1.0);
      HelpMarker(
                "When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically."
                );
      DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",0);
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to
    // (without a reference style pointer, we will use one compared locally as a reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings (expose floating-pointer border sizes as boolean representing 0.0f or 1.0f)
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &border)) { style.WindowBorderSize = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.FrameBorderSize > 0.0f);  if (ImGui::Checkbox("FrameBorder",  &border)) { style.FrameBorderSize  = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.PopupBorderSize > 0.0f);  if (ImGui::Checkbox("PopupBorder",  &border)) { style.PopupBorderSize  = border ? 1.0f : 0.0f; } }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker(
        "Save/Revert in local non-persistent storage. Default Colors definition are not affected. "
        "Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("CellPadding", (float*)&style.CellPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("LogSliderDeadzone", &style.LogSliderDeadzone, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding");
            ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE,
                            name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            if (ImGui::RadioButton("Opaque", alpha_flags == ImGuiColorEditFlags_None))             { alpha_flags = ImGuiColorEditFlags_None; } ImGui::SameLine();
            if (ImGui::RadioButton("Alpha",  alpha_flags == ImGuiColorEditFlags_AlphaPreview))     { alpha_flags = ImGuiColorEditFlags_AlphaPreview; } ImGui::SameLine();
            if (ImGui::RadioButton("Both",   alpha_flags == ImGuiColorEditFlags_AlphaPreviewHalf)) { alpha_flags = ImGuiColorEditFlags_AlphaPreviewHalf; } ImGui::SameLine();
            HelpMarker(
                "In the color list:\n"
                "Left-click on color square to open color picker,\n"
                "Right-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font,
                    // so instead of "Save"/"Revert" you'd use icons!
                    // Read the FAQ and docs/FONTS.md about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) { ref->Colors[i] = style.Colors[i]; }
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) { style.Colors[i] = ref->Colors[i]; }
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                NodeFont(font);
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            // Post-baking font scaling. Note that this is NOT the nice way of scaling fonts, read below.
            // (we enforce hard clamping manually as by default DragFloat/SliderFloat allows CTRL+Click text to get out of bounds).
            const float MIN_SCALE = 0.3f;
            const float MAX_SCALE = 2.0f;
            HelpMarker(
                "Those are old settings provided for convenience.\n"
                "However, the _correct_ way of scaling your UI is currently to reload your font at the designed size, "
                "rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\n"
                "Using those settings here will give you poor quality results.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp)) // Scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp); // Scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines);
            ImGui::SameLine();
            HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");

            ImGui::Checkbox("Anti-aliased lines use texture", &style.AntiAliasedLinesUseTex);
            ImGui::SameLine();
            HelpMarker("Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering).");

            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, 10.0f, "%.2f");
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;

            // When editing the "Circle Segment Max Error" value, draw a preview of its effect on auto-tessellated circles.
            ImGui::DragFloat("Circle Segment Max Error", &style.CircleSegmentMaxError, 0.01f, 0.10f, 10.0f, "%.2f");
            if (ImGui::IsItemActive())
            {
                ImGui::SetNextWindowPos(ImGui::GetCursorScreenPos());
                ImGui::BeginTooltip();
                ImVec2 p = ImGui::GetCursorScreenPos();
                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                float RAD_MIN = 10.0f, RAD_MAX = 80.0f;
                float off_x = 10.0f;
                for (int n = 0; n < 7; n++)
                {
                    const float rad = RAD_MIN + (RAD_MAX - RAD_MIN) * (float)n / (7.0f - 1.0f);
                    draw_list->AddCircle(ImVec2(p.x + off_x + rad, p.y + RAD_MAX), rad, ImGui::GetColorU32(ImGuiCol_Text), 0);
                    off_x += 10.0f + rad * 2.0f;
                }
                ImGui::Dummy(ImVec2(off_x, RAD_MAX * 2.0f));
                ImGui::EndTooltip();
            }
            ImGui::SameLine();
            HelpMarker("When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically.");

            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}